

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrFacialExpressionClientCreateInfoML *value)

{
  pointer *this;
  pointer *this_00;
  bool bVar1;
  string local_468 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_448;
  allocator local_429;
  string local_428 [32];
  string local_408 [32];
  ostringstream local_3e8 [8];
  ostringstream oss_enum;
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  uint local_220;
  allocator local_219;
  uint32_t value_requestedfacialblendshapes_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrFacialExpressionClientCreateInfoML *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_FACIAL_EXPRESSION_CLIENT_CREATE_INFO_ML) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrFacialExpressionClientCreateInfoML",
               value->type,"VUID-XrFacialExpressionClientCreateInfoML-type-type",
               XR_TYPE_FACIAL_EXPRESSION_CLIENT_CREATE_INFO_ML,
               "XR_TYPE_FACIAL_EXPRESSION_CLIENT_CREATE_INFO_ML");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c0,"VUID-XrFacialExpressionClientCreateInfoML-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrFacialExpressionClientCreateInfoML struct \"next\""
                 ,&local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrFacialExpressionClientCreateInfoML : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_170,"VUID-XrFacialExpressionClientCreateInfoML-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b0,
                 "Multiple structures of the same type(s) in \"next\" chain for XrFacialExpressionClientCreateInfoML struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    if ((value->requestedCount == 0) ||
       (value->requestedFacialBlendShapes != (XrFacialBlendShapeML *)0x0)) {
      if (value->requestedFacialBlendShapes != (XrFacialBlendShapeML *)0x0) {
        for (local_220 = 0; local_220 < value->requestedCount; local_220 = local_220 + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_240,"XrFacialExpressionClientCreateInfoML",&local_241);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_268,"requestedFacialBlendShapes",&local_269);
          bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_240,(string *)local_268,
                                 objects_info,value->requestedFacialBlendShapes[local_220]);
          std::__cxx11::string::~string(local_268);
          std::allocator<char>::~allocator((allocator<char> *)&local_269);
          std::__cxx11::string::~string(local_240);
          std::allocator<char>::~allocator((allocator<char> *)&local_241);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_3e8);
            std::operator<<((ostream *)local_3e8,
                            "XrFacialExpressionClientCreateInfoML contains invalid XrFacialBlendShapeML \"requestedFacialBlendShapes\" enum value "
                           );
            Uint32ToHexString_abi_cxx11_((uint32_t)local_408);
            std::operator<<((ostream *)local_3e8,local_408);
            std::__cxx11::string::~string(local_408);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_428,
                       "VUID-XrFacialExpressionClientCreateInfoML-requestedFacialBlendShapes-parameter"
                       ,&local_429);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_448,objects_info);
            std::__cxx11::ostringstream::str();
            CoreValidLogMessage(instance_info,(string *)local_428,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_448,local_468);
            std::__cxx11::string::~string((string *)local_468);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_448);
            std::__cxx11::string::~string(local_428);
            std::allocator<char>::~allocator((allocator<char> *)&local_429);
            std::__cxx11::ostringstream::~ostringstream(local_3e8);
            return XR_ERROR_VALIDATION_FAILURE;
          }
        }
      }
      instance_info_local._4_4_ =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d8,
                 "VUID-XrFacialExpressionClientCreateInfoML-requestedFacialBlendShapes-parameter",
                 &local_1d9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1f8,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&value_requestedfacialblendshapes_inc,
                 "Structure XrFacialExpressionClientCreateInfoML member requestedCount is NULL, but value->requestedCount is greater than 0"
                 ,&local_219);
      CoreValidLogMessage(instance_info,(string *)local_1d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_1f8,(string *)&value_requestedfacialblendshapes_inc);
      std::__cxx11::string::~string((string *)&value_requestedfacialblendshapes_inc);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_1f8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFacialExpressionClientCreateInfoML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_FACIAL_EXPRESSION_CLIENT_CREATE_INFO_ML) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrFacialExpressionClientCreateInfoML",
                             value->type, "VUID-XrFacialExpressionClientCreateInfoML-type-type", XR_TYPE_FACIAL_EXPRESSION_CLIENT_CREATE_INFO_ML, "XR_TYPE_FACIAL_EXPRESSION_CLIENT_CREATE_INFO_ML");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrFacialExpressionClientCreateInfoML-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrFacialExpressionClientCreateInfoML struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrFacialExpressionClientCreateInfoML : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrFacialExpressionClientCreateInfoML-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrFacialExpressionClientCreateInfoML struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->requestedCount is non-zero
    if (0 != value->requestedCount && nullptr == value->requestedFacialBlendShapes) {
        CoreValidLogMessage(instance_info, "VUID-XrFacialExpressionClientCreateInfoML-requestedFacialBlendShapes-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrFacialExpressionClientCreateInfoML member requestedCount is NULL, but value->requestedCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->requestedFacialBlendShapes) {
        for (uint32_t value_requestedfacialblendshapes_inc = 0; value_requestedfacialblendshapes_inc < value->requestedCount; ++value_requestedfacialblendshapes_inc) {
            // Make sure the enum type XrFacialBlendShapeML value is valid
            if (!ValidateXrEnum(instance_info, command_name, "XrFacialExpressionClientCreateInfoML", "requestedFacialBlendShapes", objects_info, value->requestedFacialBlendShapes[value_requestedfacialblendshapes_inc])) {
                std::ostringstream oss_enum;
                oss_enum << "XrFacialExpressionClientCreateInfoML contains invalid XrFacialBlendShapeML \"requestedFacialBlendShapes\" enum value ";
                oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->requestedFacialBlendShapes[value_requestedfacialblendshapes_inc]));
                CoreValidLogMessage(instance_info, "VUID-XrFacialExpressionClientCreateInfoML-requestedFacialBlendShapes-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, oss_enum.str());
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}